

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

string * ltrim(string *__return_storage_ptr__,string *input,string *edible)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)input,(ulong)(edible->_M_dataplus)._M_p,0)
  ;
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ltrim (const std::string& input, const std::string& edible)
{
  auto start = input.find_first_not_of (edible);
  if (start == std::string::npos)
    return "";

  return input.substr (start);
}